

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_NCountWriteBound(uint maxSymbolValue,uint tableLog)

{
  size_t sVar1;
  
  sVar1 = 0x200;
  if (maxSymbolValue != 0) {
    sVar1 = (size_t)(((maxSymbolValue + 1) * tableLog + 6 >> 3) + 3);
  }
  return sVar1;
}

Assistant:

size_t FSE_NCountWriteBound(unsigned maxSymbolValue, unsigned tableLog)
{
    size_t const maxHeaderSize = (((maxSymbolValue+1) * tableLog
                                   + 4 /* bitCount initialized at 4 */
                                   + 2 /* first two symbols may use one additional bit each */) / 8)
                                   + 1 /* round up to whole nb bytes */
                                   + 2 /* additional two bytes for bitstream flush */;
    return maxSymbolValue ? maxHeaderSize : FSE_NCOUNTBOUND;  /* maxSymbolValue==0 ? use default */
}